

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_profiler.c
# Opt level: O0

SUNErrCode SUNProfiler_GetTimerResolution(SUNProfiler p,double *resolution)

{
  double *in_RSI;
  long in_RDI;
  sunTimespec spec;
  timespec tStack_28;
  double *local_18;
  SUNErrCode local_4;
  
  if (in_RDI == 0) {
    local_4 = -9999;
  }
  else {
    local_18 = in_RSI;
    clock_getres(1,&tStack_28);
    *local_18 = (double)tStack_28.tv_nsec * 1e-09;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

SUNErrCode SUNProfiler_GetTimerResolution(SUNProfiler p, double* resolution)
{
  if (!p) { return SUN_ERR_ARG_CORRUPT; }

#if defined(SUNDIALS_HAVE_POSIX_TIMERS)
  sunTimespec spec;
  clock_getres(CLOCK_MONOTONIC, &spec);
  *resolution = 1e-9 * ((double)spec.tv_nsec);

  return SUN_SUCCESS;
#elif (defined(WIN32) || defined(_WIN32))
  static LARGE_INTEGER ticks_per_sec;

  if (!ticks_per_sec.QuadPart)
  {
    QueryPerformanceFrequency(&ticks_per_sec);
    if (!ticks_per_sec.QuadPart) { return -1; }
  }

  *resolution = (double)ticks_per_sec.QuadPart;

  return SUN_SUCCESS;
#else
#error SUNProfiler needs POSIX or Windows timers
#endif
}